

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomActionGroup::read(DomActionGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomAction *this_00;
  DomActionGroup *this_01;
  DomProperty *this_02;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  long lVar4;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_03;
  QList<DomProperty_*> *this_04;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar5;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_03 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  pQVar5 = local_50.ptr;
  for (lVar4 = 0; local_50.size * 0x68 != lVar4; lVar4 = lVar4 + 0x68) {
    local_68.m_data = *(storage_type_conflict **)(pQVar5 + 8);
    local_68.m_size = *(qsizetype *)(pQVar5 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"name",4);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar1) {
      local_98.a.m_data = *(char **)(local_50.ptr + lVar4 + 0x50);
      local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar4 + 0x58);
      QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
      setAttributeName(this,(QString *)&local_80);
    }
    else {
      local_98.a.m_size = 0x15;
      local_98.a.m_data = "Unexpected attribute ";
      local_98.b = &local_68;
      QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                ((QString *)&local_80,&local_98);
      QXmlStreamReader::raiseError((QString *)this_03);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    pQVar5 = pQVar5 + 0x68;
  }
LAB_00150966:
  while( true ) {
    bVar1 = QXmlStreamReader::hasError(this_03);
    if (bVar1) goto LAB_00150bce;
    iVar2 = QXmlStreamReader::readNext();
    if (iVar2 == 4) break;
    if (iVar2 == 5) {
LAB_00150bce:
      QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
  local_68.m_size = -0x5555555555555556;
  local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  local_68 = (QStringView)QXmlStreamReader::name();
  Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"action",6);
  sVar3 = 0;
  other.m_data = local_80.ptr;
  other.m_size = local_80.size;
  iVar2 = QStringView::compare(&local_68,other,CaseInsensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  if (iVar2 == 0) {
    this_00 = (DomAction *)operator_new(0x70);
    (this_00->m_attr_name).d.d = (Data *)0x0;
    (this_00->m_attr_name).d.ptr = (char16_t *)0x0;
    (this_00->m_attr_name).d.size = 0;
    *(undefined8 *)&this_00->m_has_attr_name = 0;
    (this_00->m_attr_menu).d.d = (Data *)0x0;
    (this_00->m_attr_menu).d.ptr = (char16_t *)0x0;
    (this_00->m_attr_menu).d.size = 0;
    this_00->m_has_attr_menu = false;
    *(undefined3 *)&this_00->field_0x39 = 0;
    this_00->m_children = 0;
    (this_00->m_property).d.d = (Data *)0x0;
    (this_00->m_property).d.ptr = (DomProperty **)0x0;
    (this_00->m_property).d.size = 0;
    (this_00->m_attribute).d.d = (Data *)0x0;
    (this_00->m_attribute).d.ptr = (DomProperty **)0x0;
    (this_00->m_attribute).d.size = 0;
    DomAction::read(this_00,__fd,__buf_00,sVar3);
    QList<DomAction_*>::append(&this->m_action,this_00);
    goto LAB_00150966;
  }
  Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"actiongroup",0xb);
  sVar3 = 0;
  other_00.m_data = local_80.ptr;
  other_00.m_size = local_80.size;
  iVar2 = QStringView::compare(&local_68,other_00,CaseInsensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  if (iVar2 == 0) {
    this_01 = (DomActionGroup *)operator_new(0x80);
    (this_01->m_attr_name).d.d = (Data *)0x0;
    (this_01->m_attr_name).d.ptr = (char16_t *)0x0;
    (this_01->m_attr_name).d.size = 0;
    this_01->m_has_attr_name = false;
    *(undefined3 *)&this_01->field_0x19 = 0;
    this_01->m_children = 0;
    (this_01->m_action).d.d = (Data *)0x0;
    (this_01->m_action).d.ptr = (DomAction **)0x0;
    (this_01->m_action).d.size = 0;
    (this_01->m_actionGroup).d.d = (Data *)0x0;
    (this_01->m_actionGroup).d.ptr = (DomActionGroup **)0x0;
    (this_01->m_actionGroup).d.size = 0;
    (this_01->m_property).d.d = (Data *)0x0;
    (this_01->m_property).d.ptr = (DomProperty **)0x0;
    (this_01->m_property).d.size = 0;
    (this_01->m_attribute).d.d = (Data *)0x0;
    (this_01->m_attribute).d.ptr = (DomProperty **)0x0;
    (this_01->m_attribute).d.size = 0;
    read(this_01,__fd,__buf_01,sVar3);
    QList<DomActionGroup_*>::append(&this->m_actionGroup,this_01);
    goto LAB_00150966;
  }
  Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"property",8);
  sVar3 = 0;
  other_01.m_data = local_80.ptr;
  other_01.m_size = local_80.size;
  iVar2 = QStringView::compare(&local_68,other_01,CaseInsensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  if (iVar2 == 0) {
    this_02 = (DomProperty *)operator_new(0x178);
    memset(this_02,0,0x178);
    DomProperty::read(this_02,__fd,__buf_02,sVar3);
    this_04 = &this->m_property;
  }
  else {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"attribute",9);
    sVar3 = 0;
    other_02.m_data = local_80.ptr;
    other_02.m_size = local_80.size;
    iVar2 = QStringView::compare(&local_68,other_02,CaseInsensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (iVar2 != 0) {
      local_98.a.m_size = 0x13;
      local_98.a.m_data = "Unexpected element ";
      local_98.b = &local_68;
      QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                ((QString *)&local_80,&local_98);
      QXmlStreamReader::raiseError((QString *)this_03);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      goto LAB_00150966;
    }
    this_02 = (DomProperty *)operator_new(0x178);
    memset(this_02,0,0x178);
    DomProperty::read(this_02,__fd,__buf_03,sVar3);
    this_04 = &this->m_attribute;
  }
  QList<DomProperty_*>::append(this_04,this_02);
  goto LAB_00150966;
}

Assistant:

void DomActionGroup::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"action"_s, Qt::CaseInsensitive)) {
                auto *v = new DomAction();
                v->read(reader);
                m_action.append(v);
                continue;
            }
            if (!tag.compare(u"actiongroup"_s, Qt::CaseInsensitive)) {
                auto *v = new DomActionGroup();
                v->read(reader);
                m_actionGroup.append(v);
                continue;
            }
            if (!tag.compare(u"property"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_property.append(v);
                continue;
            }
            if (!tag.compare(u"attribute"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                m_attribute.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}